

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_post_write_tile
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *pOVar1;
  OPJ_UINT32 OVar2;
  opj_event_mgr_t *poVar3;
  OPJ_BOOL OVar4;
  OPJ_UINT32 OVar5;
  OPJ_SIZE_T OVar6;
  uint p_value;
  ulong uVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 OVar9;
  OPJ_BYTE *pOVar10;
  OPJ_BOOL OVar11;
  OPJ_BYTE *p_data;
  ulong uVar12;
  opj_j2k_t *p_j2k_00;
  opj_stream_private_t *poVar13;
  OPJ_UINT32 l_current_nb_bytes_written_1;
  OPJ_UINT32 l_current_nb_bytes_written;
  OPJ_UINT32 local_88;
  OPJ_UINT32 local_84;
  undefined8 local_80;
  OPJ_UINT32 local_78;
  OPJ_UINT32 local_74;
  ulong local_70;
  opj_tcd *local_68;
  opj_cp_t *local_60;
  opj_j2k_t *local_58;
  OPJ_UINT32 *local_50;
  opj_tcp_t *local_48;
  opj_event_mgr_t *local_40;
  opj_stream_private_t *local_38;
  
  pOVar10 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data;
  if (pOVar10 == (OPJ_BYTE *)0x0) {
    __assert_fail("p_j2k->m_specific_param.m_encoder.m_encoded_tile_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x2d03,
                  "OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  OVar8 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size;
  local_68 = p_j2k->m_tcd;
  OVar11 = 0;
  local_68->cur_pino = 0;
  (p_j2k->m_specific_param).m_decoder.m_state = 0;
  local_84 = 0;
  OVar4 = opj_j2k_write_sot(p_j2k,pOVar10,OVar8,&local_84,p_stream,p_manager);
  if (OVar4 != 0) {
    local_60 = &p_j2k->m_cp;
    local_70 = (ulong)local_84;
    p_data = pOVar10 + local_70;
    OVar9 = OVar8 - local_84;
    local_80 = pOVar10;
    local_58 = p_j2k;
    if ((3 < (ushort)((short)*(undefined4 *)local_60 - 3U)) &&
       ((p_j2k->m_cp).tcps[p_j2k->m_current_tile_number].numpocs != 0)) {
      local_84 = 0;
      opj_j2k_write_poc_in_memory(p_j2k,p_data,&local_84,p_manager);
      p_data = p_data + local_84;
      OVar9 = OVar9 - local_84;
      local_70 = (ulong)((int)local_70 + local_84);
    }
    p_j2k_00 = local_58;
    local_84 = 0;
    OVar4 = opj_j2k_write_sod(local_58,local_68,p_data,&local_84,OVar9,p_stream,p_manager);
    if (OVar4 != 0) {
      p_value = (int)local_70 + local_84;
      local_40 = p_manager;
      opj_write_bytes_LE(local_80 + 6,p_value,4);
      if ((ushort)((short)*(undefined4 *)local_60 - 3U) < 4) {
        opj_j2k_update_tlm(p_j2k_00,p_value);
      }
      pOVar10 = local_80 + p_value;
      OVar8 = OVar8 - p_value;
      local_68 = p_j2k_00->m_tcd;
      local_48 = (p_j2k_00->m_cp).tcps;
      local_50 = (OPJ_UINT32 *)(ulong)p_j2k_00->m_current_tile_number;
      local_70 = (ulong)p_value;
      local_78 = opj_j2k_get_num_tp(local_60,0,p_j2k_00->m_current_tile_number);
      pOVar1 = &(p_j2k_00->m_specific_param).m_encoder.m_current_tile_part_number;
      *pOVar1 = *pOVar1 + 1;
      local_38 = p_stream;
      if (local_78 < 2) {
        local_80 = (OPJ_BYTE *)((ulong)local_80._4_4_ << 0x20);
      }
      else {
        OVar9 = 1;
        local_80 = (OPJ_BYTE *)((ulong)local_80._4_4_ << 0x20);
        do {
          poVar13 = local_38;
          poVar3 = local_40;
          (p_j2k_00->m_specific_param).m_decoder.m_state = OVar9;
          local_88 = 0;
          local_74 = OVar9;
          OVar4 = opj_j2k_write_sot(p_j2k_00,pOVar10,OVar8,&local_88,local_38,local_40);
          OVar9 = local_88;
          if (OVar4 == 0) {
            return 0;
          }
          uVar7 = (ulong)local_88;
          OVar8 = OVar8 - local_88;
          local_88 = 0;
          OVar4 = opj_j2k_write_sod(p_j2k_00,local_68,pOVar10 + uVar7,&local_88,OVar8,poVar13,poVar3
                                   );
          OVar2 = local_88;
          if (OVar4 == 0) {
            return 0;
          }
          uVar12 = (ulong)local_88;
          OVar5 = local_88 + OVar9;
          opj_write_bytes_LE(pOVar10 + 6,OVar5,4);
          if ((ushort)((short)*(undefined4 *)local_60 - 3U) < 4) {
            opj_j2k_update_tlm(local_58,OVar5);
          }
          pOVar10 = pOVar10 + uVar7 + uVar12;
          local_80 = (OPJ_BYTE *)CONCAT44(local_80._4_4_,(int)local_80 + OVar9 + OVar2);
          pOVar1 = &(local_58->m_specific_param).m_encoder.m_current_tile_part_number;
          *pOVar1 = *pOVar1 + 1;
          OVar8 = OVar8 - OVar2;
          OVar9 = local_74 + 1;
          p_j2k_00 = local_58;
        } while (local_78 != OVar9);
      }
      poVar13 = local_38;
      if (local_48[(long)local_50].numpocs != 0) {
        local_50 = &local_48[(long)local_50].numpocs;
        OVar9 = 1;
        do {
          local_68->cur_pino = OVar9;
          local_48 = (opj_tcp_t *)CONCAT44(local_48._4_4_,OVar9);
          local_78 = opj_j2k_get_num_tp(local_60,OVar9,p_j2k_00->m_current_tile_number);
          if (local_78 != 0) {
            OVar9 = 0;
            do {
              poVar3 = local_40;
              (p_j2k_00->m_specific_param).m_decoder.m_state = OVar9;
              local_88 = 0;
              local_74 = OVar9;
              OVar4 = opj_j2k_write_sot(p_j2k_00,pOVar10,OVar8,&local_88,poVar13,local_40);
              OVar9 = local_88;
              if (OVar4 == 0) {
                return 0;
              }
              uVar7 = (ulong)local_88;
              OVar8 = OVar8 - local_88;
              local_88 = 0;
              OVar4 = opj_j2k_write_sod(p_j2k_00,local_68,pOVar10 + uVar7,&local_88,OVar8,poVar13,
                                        poVar3);
              OVar2 = local_88;
              if (OVar4 == 0) {
                return 0;
              }
              uVar12 = (ulong)local_88;
              OVar5 = local_88 + OVar9;
              opj_write_bytes_LE(pOVar10 + 6,OVar5,4);
              if ((ushort)((short)*(undefined4 *)local_60 - 3U) < 4) {
                opj_j2k_update_tlm(local_58,OVar5);
              }
              local_80 = (OPJ_BYTE *)CONCAT44(local_80._4_4_,(int)local_80 + OVar9 + OVar2);
              pOVar10 = pOVar10 + uVar7 + uVar12;
              pOVar1 = &(local_58->m_specific_param).m_encoder.m_current_tile_part_number;
              *pOVar1 = *pOVar1 + 1;
              OVar8 = OVar8 - OVar2;
              OVar9 = local_74 + 1;
              p_j2k_00 = local_58;
              poVar13 = local_38;
            } while (local_78 != OVar9);
          }
          OVar9 = (int)local_48 + 1;
        } while (OVar9 <= *local_50);
      }
      uVar7 = (ulong)(uint)((int)local_70 + (int)local_80);
      OVar6 = opj_stream_write_data
                        (poVar13,(p_j2k_00->m_specific_param).m_encoder.m_encoded_tile_data,uVar7,
                         local_40);
      OVar11 = 0;
      if (OVar6 == uVar7) {
        p_j2k_00->m_current_tile_number = p_j2k_00->m_current_tile_number + 1;
        OVar11 = 1;
      }
    }
  }
  return OVar11;
}

Assistant:

static OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t * p_j2k,
                                        opj_stream_private_t *p_stream,
                                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 l_nb_bytes_written;
    OPJ_BYTE * l_current_data = 00;
    OPJ_UINT32 l_tile_size = 0;
    OPJ_UINT32 l_available_data;

    /* preconditions */
    assert(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);

    l_tile_size = p_j2k->m_specific_param.m_encoder.m_encoded_tile_size;
    l_available_data = l_tile_size;
    l_current_data = p_j2k->m_specific_param.m_encoder.m_encoded_tile_data;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_first_tile_part(p_j2k, l_current_data, &l_nb_bytes_written,
                                        l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }
    l_current_data += l_nb_bytes_written;
    l_available_data -= l_nb_bytes_written;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_all_tile_parts(p_j2k, l_current_data, &l_nb_bytes_written,
                                       l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    l_available_data -= l_nb_bytes_written;
    l_nb_bytes_written = l_tile_size - l_available_data;

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_encoded_tile_data,
                              l_nb_bytes_written, p_manager) != l_nb_bytes_written) {
        return OPJ_FALSE;
    }

    ++p_j2k->m_current_tile_number;

    return OPJ_TRUE;
}